

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O2

int attlist3(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  int iVar1;
  code *pcVar2;
  
  iVar1 = 0x1f;
  pcVar2 = attlist4;
  if (1 < tok - 0x12U) {
    if (tok == 0xf) {
      return 0x21;
    }
    if (tok != 0x29) {
      iVar1 = -1;
      pcVar2 = error;
      if ((tok == 0x1c) && (state->documentEntity == 0)) {
        return 0x3b;
      }
    }
  }
  state->handler = pcVar2;
  return iVar1;
}

Assistant:

static int PTRCALL
attlist3(PROLOG_STATE *state, int tok, const char *ptr, const char *end,
         const ENCODING *enc) {
  UNUSED_P(ptr);
  UNUSED_P(end);
  UNUSED_P(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_ATTLIST_NONE;
  case XML_TOK_NMTOKEN:
  case XML_TOK_NAME:
  case XML_TOK_PREFIXED_NAME:
    state->handler = attlist4;
    return XML_ROLE_ATTRIBUTE_ENUM_VALUE;
  }
  return common(state, tok);
}